

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

void __thiscall soul::SimpleTokeniser::throwError(SimpleTokeniser *this,CompileMessage *message)

{
  pointer pcVar1;
  CompileMessage local_58;
  
  local_58.description._M_dataplus._M_p = (pointer)&local_58.description.field_2;
  pcVar1 = (message->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (message->description)._M_string_length);
  local_58.location.sourceCode.object = (message->location).sourceCode.object;
  if (local_58.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_58.location.location.data = (message->location).location.data;
  local_58.type = message->type;
  local_58.category = message->category;
  CodeLocation::throwError(&(this->super_SOULTokeniser).location,&local_58);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        location.throwError (message);
    }